

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O0

void LoadScriptResources(ResourceManager *ResMan,string *NWNHome,string *InstallDir,bool Erf16,
                        int Compilerversion)

{
  int in_R8D;
  StringVec KeyFiles;
  ModuleLoadParams LoadParams;
  ModuleLoadParams *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  ResourceManager *in_stack_ffffffffffffff80;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c4b6c);
  memset(&stack0xffffffffffffff80,0,0x60);
  if (in_R8D < 0xae) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [4])in_stack_ffffffffffffff68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [9])in_stack_ffffffffffffff68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [4])in_stack_ffffffffffffff68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [4])in_stack_ffffffffffffff68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [7])in_stack_ffffffffffffff68);
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff70,(char (*) [14])in_stack_ffffffffffffff68);
  }
  ResourceManager::LoadScriptResources
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void
LoadScriptResources(
        ResourceManager &ResMan,
        const std::string &NWNHome,
        const std::string &InstallDir,
        bool Erf16,
        int Compilerversion
)
/*++

Routine Description:

	This routine loads the game script data into the resource system.

Arguments:

	ResMan - Supplies the ResourceManager instance that is to load the module.

	NWNHome - Supplies the users NWN2 home directory (i.e. NWN2 Documents dir).

	InstallDir - Supplies the game installation directory.

	Erf16 - Supplies a Boolean value indicating true if 16-byte ERFs are to be
	        used (i.e. for NWN1-style modules), else false if 32-byte ERFs are
	        to be used (i.e. for NWN2-style modules).

	CustomModPath - Optionally supplies an override path to search for a module
	                file within, bypassing the standard module load heuristics.

Return Value:

	None.  On failure, an std::exception is raised.

Environment:

	User mode.

--*/
{
    ResourceManager::ModuleLoadParams LoadParams;
    ResourceManager::StringVec KeyFiles;

    ZeroMemory(&LoadParams, sizeof(LoadParams));

    LoadParams.SearchOrder = ResourceManager::ModSearch_PrefDirectory;
    LoadParams.ResManFlags = ResourceManager::ResManFlagNoGranny2;

    LoadParams.ResManFlags |= ResourceManager::ResManFlagErf16;

    if (Compilerversion >= 174) {
#ifdef _WINDOWS
		KeyFiles.push_back("data\\nwn_base");
#else
		KeyFiles.emplace_back("data/nwn_base");
#endif // _WINDOWS
    } else {
        KeyFiles.emplace_back("xp3");
        KeyFiles.emplace_back("xp2patch");
        KeyFiles.emplace_back("xp2");
        //KeyFiles.emplace_back("xp1patch");
        KeyFiles.emplace_back("xp1");
        KeyFiles.emplace_back("chitin");
    }

    LoadParams.KeyFiles = &KeyFiles;

    LoadParams.ResManFlags |= ResourceManager::ResManFlagBaseResourcesOnly;

    ResMan.LoadScriptResources(
            NWNHome,
            InstallDir,
            &LoadParams
    );
}